

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AS_02_ACES.cpp
# Opt level: O3

ACES * __thiscall
AS_02::ACES::ACES_PDesc_to_MD
          (ACES *this,PictureDescriptor *PDesc,Dictionary *dict,
          RGBAEssenceDescriptor *EssenceDescriptor)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  undefined8 *puVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  pointer pcVar12;
  undefined1 *puVar13;
  undefined8 uVar14;
  MDD_t MVar15;
  pointer pcVar16;
  int iVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 uStack_38;
  
  *(ulong *)(EssenceDescriptor + 0xf8) = (ulong)PDesc->ContainerDuration;
  EssenceDescriptor[0x100] = (RGBAEssenceDescriptor)0x1;
  *(Rational *)(EssenceDescriptor + 0xf0) = PDesc->EditRate;
  EssenceDescriptor[0x152] = (RGBAEssenceDescriptor)0x0;
  uVar1 = (PDesc->DataWindow).xMax;
  uVar2 = (PDesc->DataWindow).yMax;
  uVar3 = (PDesc->DataWindow).xMin;
  uVar4 = (PDesc->DataWindow).yMin;
  *(ulong *)(EssenceDescriptor + 0x154) = CONCAT44((uVar2 - uVar4) + 1,(uVar1 - uVar3) + 1);
  iVar7 = (PDesc->DisplayWindow).xMin;
  iVar5 = ((PDesc->DisplayWindow).xMax - iVar7) + 1;
  *(int *)(EssenceDescriptor + 0x18c) = iVar5;
  EssenceDescriptor[400] = (RGBAEssenceDescriptor)0x1;
  iVar11 = (PDesc->DisplayWindow).yMin;
  iVar9 = ((PDesc->DisplayWindow).yMax - iVar11) + 1;
  *(int *)(EssenceDescriptor + 0x184) = iVar9;
  EssenceDescriptor[0x188] = (RGBAEssenceDescriptor)0x1;
  *(int *)(EssenceDescriptor + 0x194) = iVar7 - uVar3;
  EssenceDescriptor[0x198] = (RGBAEssenceDescriptor)0x1;
  *(int *)(EssenceDescriptor + 0x19c) = iVar11 - uVar4;
  EssenceDescriptor[0x1a0] = (RGBAEssenceDescriptor)0x1;
  if (iVar9 != 0) {
    dVar18 = (double)iVar5 / (double)iVar9;
    iVar7 = 0;
    iVar11 = 0;
    iVar5 = 1;
    iVar9 = 1;
    do {
      iVar10 = iVar11;
      iVar17 = (int)(long)dVar18;
      iVar11 = iVar10 * iVar17 + iVar5;
      iVar6 = iVar9 * iVar17 + iVar7;
      dVar19 = (double)iVar17;
      if ((dVar18 == dVar19) && (!NAN(dVar18) && !NAN(dVar19))) break;
      dVar20 = 1.0 / (dVar18 - dVar19);
      dVar18 = (double)(~-(ulong)(dVar19 != dVar18) & (ulong)dVar18 |
                       -(ulong)(dVar19 != dVar18) & (ulong)dVar20);
      iVar7 = iVar9;
      iVar5 = iVar10;
      iVar9 = iVar6;
    } while (dVar20 <= 2147483647.0);
    *(int *)(EssenceDescriptor + 0x1b8) = iVar6;
    *(int *)(EssenceDescriptor + 0x1bc) = iVar11;
  }
  *(undefined2 *)(EssenceDescriptor + 0x1c2) = 0x100;
  MVar15 = (MDD_t)dict;
  puVar8 = (undefined8 *)ASDCP::Dictionary::Type(MVar15);
  local_48 = *puVar8;
  uStack_40 = puVar8[1];
  EssenceDescriptor[0x260] = (RGBAEssenceDescriptor)0x1;
  *(undefined8 *)(EssenceDescriptor + 0x261) = local_48;
  *(undefined8 *)(EssenceDescriptor + 0x269) = uStack_40;
  EssenceDescriptor[0x278] = (RGBAEssenceDescriptor)0x1;
  puVar8 = (undefined8 *)ASDCP::Dictionary::Type(MVar15);
  local_48 = *puVar8;
  uStack_40 = puVar8[1];
  EssenceDescriptor[0x1d0] = (RGBAEssenceDescriptor)0x1;
  *(undefined8 *)(EssenceDescriptor + 0x1d1) = local_48;
  *(undefined8 *)(EssenceDescriptor + 0x1d9) = uStack_40;
  EssenceDescriptor[0x1e8] = (RGBAEssenceDescriptor)0x1;
  pcVar16 = (PDesc->Channels).
            super__Vector_base<AS_02::ACES::channel,_std::allocator<AS_02::ACES::channel>_>._M_impl.
            super__Vector_impl_data._M_start;
  pcVar12 = (PDesc->Channels).
            super__Vector_base<AS_02::ACES::channel,_std::allocator<AS_02::ACES::channel>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if ((long)pcVar12 - (long)pcVar16 == 0x90) {
    iVar7 = std::__cxx11::string::compare((char *)pcVar16);
    pcVar16 = (PDesc->Channels).
              super__Vector_base<AS_02::ACES::channel,_std::allocator<AS_02::ACES::channel>_>.
              _M_impl.super__Vector_impl_data._M_start;
    pcVar12 = (PDesc->Channels).
              super__Vector_base<AS_02::ACES::channel,_std::allocator<AS_02::ACES::channel>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    if (iVar7 != 0) goto LAB_0014fa7e;
    if (1 < (ulong)(((long)pcVar12 - (long)pcVar16 >> 4) * -0x5555555555555555)) {
      iVar7 = std::__cxx11::string::compare((char *)(pcVar16 + 1));
      pcVar16 = (PDesc->Channels).
                super__Vector_base<AS_02::ACES::channel,_std::allocator<AS_02::ACES::channel>_>.
                _M_impl.super__Vector_impl_data._M_start;
      pcVar12 = (PDesc->Channels).
                super__Vector_base<AS_02::ACES::channel,_std::allocator<AS_02::ACES::channel>_>.
                _M_impl.super__Vector_impl_data._M_finish;
      if (iVar7 != 0) goto LAB_0014fa7e;
      if (2 < (ulong)(((long)pcVar12 - (long)pcVar16 >> 4) * -0x5555555555555555)) {
        iVar7 = std::__cxx11::string::compare((char *)(pcVar16 + 2));
        if (iVar7 != 0) {
          pcVar16 = (PDesc->Channels).
                    super__Vector_base<AS_02::ACES::channel,_std::allocator<AS_02::ACES::channel>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          pcVar12 = (PDesc->Channels).
                    super__Vector_base<AS_02::ACES::channel,_std::allocator<AS_02::ACES::channel>_>.
                    _M_impl.super__Vector_impl_data._M_finish;
          goto LAB_0014fa7e;
        }
        puVar8 = (undefined8 *)ASDCP::Dictionary::Type(MVar15);
        local_48 = *puVar8;
        uStack_40 = puVar8[1];
        EssenceDescriptor[0x218] = (RGBAEssenceDescriptor)0x1;
        *(undefined8 *)(EssenceDescriptor + 0x219) = local_48;
        *(undefined8 *)(EssenceDescriptor + 0x221) = uStack_40;
        puVar13 = ACESPixelLayoutMonoscopicWOAlpha;
LAB_0014febb:
        ASDCP::MXF::RGBALayout::RGBALayout((RGBALayout *)&local_48,puVar13);
        *(undefined8 *)(EssenceDescriptor + 0x398) = uStack_40;
        *(undefined8 *)(EssenceDescriptor + 0x3a0) = uStack_38;
        ASDCP::MXF::RGBALayout::~RGBALayout((RGBALayout *)&local_48);
        puVar13 = Kumu::RESULT_OK;
        goto LAB_0014fe3b;
      }
LAB_0014fef2:
      uVar14 = 2;
      goto LAB_0014ff0c;
    }
LAB_0014fee4:
    uVar14 = 1;
LAB_0014ff0c:
    do {
      std::__throw_out_of_range_fmt
                ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar14)
      ;
LAB_0014ff13:
      uVar14 = 4;
    } while( true );
  }
LAB_0014fa7e:
  if ((long)pcVar12 - (long)pcVar16 == 0xc0) {
    iVar7 = std::__cxx11::string::compare((char *)pcVar16);
    pcVar16 = (PDesc->Channels).
              super__Vector_base<AS_02::ACES::channel,_std::allocator<AS_02::ACES::channel>_>.
              _M_impl.super__Vector_impl_data._M_start;
    pcVar12 = (PDesc->Channels).
              super__Vector_base<AS_02::ACES::channel,_std::allocator<AS_02::ACES::channel>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    if (iVar7 != 0) goto LAB_0014fb50;
    if ((ulong)(((long)pcVar12 - (long)pcVar16 >> 4) * -0x5555555555555555) < 2) goto LAB_0014fee4;
    iVar7 = std::__cxx11::string::compare((char *)(pcVar16 + 1));
    pcVar16 = (PDesc->Channels).
              super__Vector_base<AS_02::ACES::channel,_std::allocator<AS_02::ACES::channel>_>.
              _M_impl.super__Vector_impl_data._M_start;
    pcVar12 = (PDesc->Channels).
              super__Vector_base<AS_02::ACES::channel,_std::allocator<AS_02::ACES::channel>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    if (iVar7 != 0) goto LAB_0014fb50;
    if ((ulong)(((long)pcVar12 - (long)pcVar16 >> 4) * -0x5555555555555555) < 3) goto LAB_0014fef2;
    iVar7 = std::__cxx11::string::compare((char *)(pcVar16 + 2));
    pcVar16 = (PDesc->Channels).
              super__Vector_base<AS_02::ACES::channel,_std::allocator<AS_02::ACES::channel>_>.
              _M_impl.super__Vector_impl_data._M_start;
    pcVar12 = (PDesc->Channels).
              super__Vector_base<AS_02::ACES::channel,_std::allocator<AS_02::ACES::channel>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    if (iVar7 != 0) goto LAB_0014fb50;
    if (3 < (ulong)(((long)pcVar12 - (long)pcVar16 >> 4) * -0x5555555555555555)) {
      iVar7 = std::__cxx11::string::compare((char *)(pcVar16 + 3));
      if (iVar7 == 0) {
        puVar8 = (undefined8 *)ASDCP::Dictionary::Type(MVar15);
        local_48 = *puVar8;
        uStack_40 = puVar8[1];
        EssenceDescriptor[0x218] = (RGBAEssenceDescriptor)0x1;
        *(undefined8 *)(EssenceDescriptor + 0x219) = local_48;
        *(undefined8 *)(EssenceDescriptor + 0x221) = uStack_40;
        puVar13 = ACESPixelLayoutMonoscopicWAlpha;
        goto LAB_0014febb;
      }
      pcVar16 = (PDesc->Channels).
                super__Vector_base<AS_02::ACES::channel,_std::allocator<AS_02::ACES::channel>_>.
                _M_impl.super__Vector_impl_data._M_start;
      pcVar12 = (PDesc->Channels).
                super__Vector_base<AS_02::ACES::channel,_std::allocator<AS_02::ACES::channel>_>.
                _M_impl.super__Vector_impl_data._M_finish;
      goto LAB_0014fb50;
    }
LAB_0014ff00:
    uVar14 = 3;
    goto LAB_0014ff0c;
  }
LAB_0014fb50:
  if ((long)pcVar12 - (long)pcVar16 == 0x120) {
    iVar7 = std::__cxx11::string::compare((char *)pcVar16);
    pcVar16 = (PDesc->Channels).
              super__Vector_base<AS_02::ACES::channel,_std::allocator<AS_02::ACES::channel>_>.
              _M_impl.super__Vector_impl_data._M_start;
    pcVar12 = (PDesc->Channels).
              super__Vector_base<AS_02::ACES::channel,_std::allocator<AS_02::ACES::channel>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    if (iVar7 != 0) goto LAB_0014fc92;
    if ((ulong)(((long)pcVar12 - (long)pcVar16 >> 4) * -0x5555555555555555) < 2) goto LAB_0014fee4;
    iVar7 = std::__cxx11::string::compare((char *)(pcVar16 + 1));
    pcVar16 = (PDesc->Channels).
              super__Vector_base<AS_02::ACES::channel,_std::allocator<AS_02::ACES::channel>_>.
              _M_impl.super__Vector_impl_data._M_start;
    pcVar12 = (PDesc->Channels).
              super__Vector_base<AS_02::ACES::channel,_std::allocator<AS_02::ACES::channel>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    if (iVar7 != 0) goto LAB_0014fc92;
    if ((ulong)(((long)pcVar12 - (long)pcVar16 >> 4) * -0x5555555555555555) < 3) goto LAB_0014fef2;
    iVar7 = std::__cxx11::string::compare((char *)(pcVar16 + 2));
    pcVar16 = (PDesc->Channels).
              super__Vector_base<AS_02::ACES::channel,_std::allocator<AS_02::ACES::channel>_>.
              _M_impl.super__Vector_impl_data._M_start;
    pcVar12 = (PDesc->Channels).
              super__Vector_base<AS_02::ACES::channel,_std::allocator<AS_02::ACES::channel>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    if (iVar7 != 0) goto LAB_0014fc92;
    if ((ulong)(((long)pcVar12 - (long)pcVar16 >> 4) * -0x5555555555555555) < 4) goto LAB_0014ff00;
    iVar7 = std::__cxx11::string::compare((char *)(pcVar16 + 3));
    pcVar16 = (PDesc->Channels).
              super__Vector_base<AS_02::ACES::channel,_std::allocator<AS_02::ACES::channel>_>.
              _M_impl.super__Vector_impl_data._M_start;
    pcVar12 = (PDesc->Channels).
              super__Vector_base<AS_02::ACES::channel,_std::allocator<AS_02::ACES::channel>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    if (iVar7 != 0) goto LAB_0014fc92;
    if ((ulong)(((long)pcVar12 - (long)pcVar16 >> 4) * -0x5555555555555555) < 5) goto LAB_0014ff13;
    iVar7 = std::__cxx11::string::compare((char *)(pcVar16 + 4));
    pcVar16 = (PDesc->Channels).
              super__Vector_base<AS_02::ACES::channel,_std::allocator<AS_02::ACES::channel>_>.
              _M_impl.super__Vector_impl_data._M_start;
    pcVar12 = (PDesc->Channels).
              super__Vector_base<AS_02::ACES::channel,_std::allocator<AS_02::ACES::channel>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    if (iVar7 != 0) goto LAB_0014fc92;
    if ((ulong)(((long)pcVar12 - (long)pcVar16 >> 4) * -0x5555555555555555) < 6) {
LAB_0014ff21:
      uVar14 = 5;
      goto LAB_0014ff0c;
    }
    iVar7 = std::__cxx11::string::compare((char *)(pcVar16 + 5));
    if (iVar7 != 0) {
      pcVar16 = (PDesc->Channels).
                super__Vector_base<AS_02::ACES::channel,_std::allocator<AS_02::ACES::channel>_>.
                _M_impl.super__Vector_impl_data._M_start;
      pcVar12 = (PDesc->Channels).
                super__Vector_base<AS_02::ACES::channel,_std::allocator<AS_02::ACES::channel>_>.
                _M_impl.super__Vector_impl_data._M_finish;
      goto LAB_0014fc92;
    }
  }
  else {
LAB_0014fc92:
    if ((long)pcVar12 - (long)pcVar16 == 0x180) {
      iVar7 = std::__cxx11::string::compare((char *)pcVar16);
      if (iVar7 == 0) {
        pcVar16 = (PDesc->Channels).
                  super__Vector_base<AS_02::ACES::channel,_std::allocator<AS_02::ACES::channel>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        if ((ulong)(((long)(PDesc->Channels).
                           super__Vector_base<AS_02::ACES::channel,_std::allocator<AS_02::ACES::channel>_>
                           ._M_impl.super__Vector_impl_data._M_finish - (long)pcVar16 >> 4) *
                   -0x5555555555555555) < 2) goto LAB_0014fee4;
        iVar7 = std::__cxx11::string::compare((char *)(pcVar16 + 1));
        if (iVar7 == 0) {
          pcVar16 = (PDesc->Channels).
                    super__Vector_base<AS_02::ACES::channel,_std::allocator<AS_02::ACES::channel>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          if ((ulong)(((long)(PDesc->Channels).
                             super__Vector_base<AS_02::ACES::channel,_std::allocator<AS_02::ACES::channel>_>
                             ._M_impl.super__Vector_impl_data._M_finish - (long)pcVar16 >> 4) *
                     -0x5555555555555555) < 3) goto LAB_0014fef2;
          iVar7 = std::__cxx11::string::compare((char *)(pcVar16 + 2));
          if (iVar7 == 0) {
            pcVar16 = (PDesc->Channels).
                      super__Vector_base<AS_02::ACES::channel,_std::allocator<AS_02::ACES::channel>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            if ((ulong)(((long)(PDesc->Channels).
                               super__Vector_base<AS_02::ACES::channel,_std::allocator<AS_02::ACES::channel>_>
                               ._M_impl.super__Vector_impl_data._M_finish - (long)pcVar16 >> 4) *
                       -0x5555555555555555) < 4) goto LAB_0014ff00;
            iVar7 = std::__cxx11::string::compare((char *)(pcVar16 + 3));
            if (iVar7 == 0) {
              pcVar16 = (PDesc->Channels).
                        super__Vector_base<AS_02::ACES::channel,_std::allocator<AS_02::ACES::channel>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              if ((ulong)(((long)(PDesc->Channels).
                                 super__Vector_base<AS_02::ACES::channel,_std::allocator<AS_02::ACES::channel>_>
                                 ._M_impl.super__Vector_impl_data._M_finish - (long)pcVar16 >> 4) *
                         -0x5555555555555555) < 5) goto LAB_0014ff13;
              iVar7 = std::__cxx11::string::compare((char *)(pcVar16 + 4));
              if (iVar7 == 0) {
                pcVar16 = (PDesc->Channels).
                          super__Vector_base<AS_02::ACES::channel,_std::allocator<AS_02::ACES::channel>_>
                          ._M_impl.super__Vector_impl_data._M_start;
                if ((ulong)(((long)(PDesc->Channels).
                                   super__Vector_base<AS_02::ACES::channel,_std::allocator<AS_02::ACES::channel>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)pcVar16 >> 4)
                           * -0x5555555555555555) < 6) goto LAB_0014ff21;
                iVar7 = std::__cxx11::string::compare((char *)(pcVar16 + 5));
                if (iVar7 == 0) {
                  pcVar16 = (PDesc->Channels).
                            super__Vector_base<AS_02::ACES::channel,_std::allocator<AS_02::ACES::channel>_>
                            ._M_impl.super__Vector_impl_data._M_start;
                  if ((ulong)(((long)(PDesc->Channels).
                                     super__Vector_base<AS_02::ACES::channel,_std::allocator<AS_02::ACES::channel>_>
                                     ._M_impl.super__Vector_impl_data._M_finish - (long)pcVar16 >> 4
                              ) * -0x5555555555555555) < 7) {
                    uVar14 = 6;
                    goto LAB_0014ff0c;
                  }
                  iVar7 = std::__cxx11::string::compare((char *)(pcVar16 + 6));
                  if (iVar7 == 0) {
                    pcVar16 = (PDesc->Channels).
                              super__Vector_base<AS_02::ACES::channel,_std::allocator<AS_02::ACES::channel>_>
                              ._M_impl.super__Vector_impl_data._M_start;
                    if ((ulong)(((long)(PDesc->Channels).
                                       super__Vector_base<AS_02::ACES::channel,_std::allocator<AS_02::ACES::channel>_>
                                       ._M_impl.super__Vector_impl_data._M_finish - (long)pcVar16 >>
                                4) * -0x5555555555555555) < 8) {
                      uVar14 = 7;
                      goto LAB_0014ff0c;
                    }
                    std::__cxx11::string::compare((char *)(pcVar16 + 7));
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  puVar13 = Kumu::RESULT_NOTIMPL;
LAB_0014fe3b:
  Kumu::Result_t::Result_t((Result_t *)this,(Result_t *)puVar13);
  return this;
}

Assistant:

AS_02::Result_t AS_02::ACES::ACES_PDesc_to_MD(const PictureDescriptor &PDesc, const ASDCP::Dictionary &dict, ASDCP::MXF::RGBAEssenceDescriptor &EssenceDescriptor)
{

  EssenceDescriptor.ContainerDuration = PDesc.ContainerDuration;
  EssenceDescriptor.SampleRate = PDesc.EditRate;
  EssenceDescriptor.FrameLayout = 0x00;
  EssenceDescriptor.StoredWidth = PDesc.DataWindow.xMax - PDesc.DataWindow.xMin + 1;
  EssenceDescriptor.StoredHeight = PDesc.DataWindow.yMax - PDesc.DataWindow.yMin + 1;
  EssenceDescriptor.DisplayWidth = PDesc.DisplayWindow.xMax - PDesc.DisplayWindow.xMin + 1;
  EssenceDescriptor.DisplayHeight = PDesc.DisplayWindow.yMax - PDesc.DisplayWindow.yMin + 1;
  EssenceDescriptor.DisplayXOffset = PDesc.DisplayWindow.xMin - PDesc.DataWindow.xMin;
  EssenceDescriptor.DisplayYOffset = PDesc.DisplayWindow.yMin - PDesc.DataWindow.yMin;
  ASDCP::Rational aspect_ratio(EssenceDescriptor.DisplayWidth, EssenceDescriptor.DisplayHeight);
  if(aspect_ratio.Denominator != 0)  EssenceDescriptor.AspectRatio = AS_02::ConvertToRational(aspect_ratio.Quotient());
  EssenceDescriptor.AlphaTransparency = 0x00;
  EssenceDescriptor.ColorPrimaries = dict.ul(MDD_ColorPrimaries_ACES);
  EssenceDescriptor.TransferCharacteristic = dict.ul(MDD_TransferCharacteristic_linear);
  if(PDesc.Channels.size() == 3 && PDesc.Channels.at(0).name == "B" && PDesc.Channels.at(1).name == "G" && PDesc.Channels.at(2).name == "R")
  {
    EssenceDescriptor.PictureEssenceCoding = dict.ul(MDD_ACESUncompressedMonoscopicWithoutAlpha); //Picture Essence Coding Label per 2065-5 section 8.2
    EssenceDescriptor.PixelLayout = RGBALayout(ACESPixelLayoutMonoscopicWOAlpha);
  }
  else if(PDesc.Channels.size() == 4 && PDesc.Channels.at(0).name == "A" && PDesc.Channels.at(1).name == "B" && PDesc.Channels.at(2).name == "G" && PDesc.Channels.at(3).name == "R")
  {
    EssenceDescriptor.PictureEssenceCoding = dict.ul(MDD_ACESUncompressedMonoscopicWithAlpha); //Picture Essence Coding Label per 2065-5
    EssenceDescriptor.PixelLayout = RGBALayout(ACESPixelLayoutMonoscopicWAlpha);
  }
  else if(PDesc.Channels.size() == 6 && PDesc.Channels.at(0).name == "B" && PDesc.Channels.at(1).name == "G" && PDesc.Channels.at(2).name == "R" &&
                            PDesc.Channels.at(3).name == "left.B" && PDesc.Channels.at(4).name == "left.G" && PDesc.Channels.at(5).name == "left.R")
  {
    return RESULT_NOTIMPL;
  }
  else if(PDesc.Channels.size() == 8 && PDesc.Channels.at(0).name == "A" && PDesc.Channels.at(1).name == "B" && PDesc.Channels.at(2).name == "G" && PDesc.Channels.at(3).name == "R" &&
                            PDesc.Channels.at(4).name == "left.A" && PDesc.Channels.at(5).name == "left.B" && PDesc.Channels.at(6).name == "left.G" && PDesc.Channels.at(7).name == "left.R")
  {
    return RESULT_NOTIMPL;
  }
  else
  {
    return RESULT_NOTIMPL;
  }
  return RESULT_OK;
}